

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

void spvtools::val::anon_unknown_0::ComputeMemberConstraintsForArray
               (MemberConstraints *constraints,uint32_t array_id,LayoutConstraints *inherited,
               ValidationState_t *vstate)

{
  uint32_t id;
  Op OVar1;
  Instruction *pIVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  const_reference pvVar3;
  Op opcode;
  Instruction *elem_type_inst;
  value_type elem_type_id;
  ValidationState_t *vstate_local;
  LayoutConstraints *inherited_local;
  uint32_t array_id_local;
  MemberConstraints *constraints_local;
  
  if (constraints == (MemberConstraints *)0x0) {
    __assert_fail("constraints",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x443,
                  "void spvtools::val::(anonymous namespace)::ComputeMemberConstraintsForArray(MemberConstraints *, uint32_t, const LayoutConstraints &, ValidationState_t &)"
                 );
  }
  pIVar2 = ValidationState_t::FindDef(vstate,array_id);
  this = Instruction::words(pIVar2);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,2);
  id = *pvVar3;
  pIVar2 = ValidationState_t::FindDef(vstate,id);
  OVar1 = Instruction::opcode(pIVar2);
  if (OVar1 - OpTypeArray < 2) {
    ComputeMemberConstraintsForArray(constraints,id,inherited,vstate);
  }
  else if (OVar1 == OpTypeStruct) {
    ComputeMemberConstraintsForStruct(constraints,id,inherited,vstate);
  }
  return;
}

Assistant:

void ComputeMemberConstraintsForArray(MemberConstraints* constraints,
                                      uint32_t array_id,
                                      const LayoutConstraints& inherited,
                                      ValidationState_t& vstate) {
  assert(constraints);
  auto elem_type_id = vstate.FindDef(array_id)->words()[2];
  const auto elem_type_inst = vstate.FindDef(elem_type_id);
  const auto opcode = elem_type_inst->opcode();
  switch (opcode) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      ComputeMemberConstraintsForArray(constraints, elem_type_id, inherited,
                                       vstate);
      break;
    case spv::Op::OpTypeStruct:
      ComputeMemberConstraintsForStruct(constraints, elem_type_id, inherited,
                                        vstate);
      break;
    default:
      break;
  }
}